

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
fasttext::HierarchicalSoftmaxLoss::HierarchicalSoftmaxLoss
          (HierarchicalSoftmaxLoss *this,shared_ptr<fasttext::Matrix> *wo,
          vector<long,_std::allocator<long>_> *targetCounts)

{
  Loss::Loss((Loss *)this,wo);
  (this->super_BinaryLogisticLoss).super_Loss._vptr_Loss =
       (_func_int **)&PTR__HierarchicalSoftmaxLoss_0013bba8;
  (this->paths_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->paths_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->paths_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->codes_).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->codes_).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->codes_).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tree_).
  super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tree_).
  super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tree_).
  super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->osz_ = (int32_t)((ulong)((long)(targetCounts->
                                       super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(targetCounts->super__Vector_base<long,_std::allocator<long>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3);
  buildTree(this,targetCounts);
  return;
}

Assistant:

HierarchicalSoftmaxLoss::HierarchicalSoftmaxLoss(
    std::shared_ptr<Matrix>& wo,
    const std::vector<int64_t>& targetCounts)
    : BinaryLogisticLoss(wo),
      paths_(),
      codes_(),
      tree_(),
      osz_(targetCounts.size()) {
  buildTree(targetCounts);
}